

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratches.cpp
# Opt level: O2

bool test_scratches(void)

{
  int iVar1;
  ostream *poVar2;
  int cur;
  long lVar3;
  int last_nonzero_idx;
  int iVar4;
  iterator __begin1;
  int *piVar5;
  initializer_list<int> __l;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> nums;
  int local_38 [8];
  
  local_38[4] = 9;
  local_38[5] = 0x17;
  local_38[6] = 0x22;
  local_38[7] = 0x38;
  local_38[0] = 1;
  local_38[1] = 3;
  local_38[2] = 4;
  local_38[3] = 6;
  __l._M_len = 8;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&nums,__l,&local_51);
  iVar4 = 0;
  for (lVar3 = 0;
      piVar5 = nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,
      (long)nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start >> 2 != lVar3; lVar3 = lVar3 + 1) {
    if ((nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [lVar3] & 1U) == 0) {
      iVar1 = nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar4];
      nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar4] = nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar3];
      nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar3] = iVar1;
      iVar4 = iVar4 + 1;
    }
  }
  do {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar2," ");
    piVar5 = piVar5 + 1;
  } while( true );
}

Assistant:

bool test_scratches(){
    vector<int> nums{1,3,4,6,9,23,34,56};
    for(int last_nonzero_idx=0,cur=0;cur < nums.size();cur++){
        if(nums[cur] %2 == 0)
            swap(nums[last_nonzero_idx++],nums[cur]);
    }

    for (int item:nums){
        cout << item << " ";
    }
}